

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

bool __thiscall QCss::Parser::parseSimpleSelector(Parser *this,BasicSelector *basicSel)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  long in_FS_OFFSET;
  bool bVar4;
  Pseudo local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = lookupElementName(this);
  if (bVar1) {
    bVar1 = parseElementName(this,&basicSel->elementName);
    bVar4 = false;
    uVar2 = 0;
    if (!bVar1) goto LAB_00546f4d;
  }
  else {
    this->index = this->index + -1;
    uVar2 = 1;
  }
  uVar3 = 0;
  do {
    bVar1 = test(this,HASH);
    if (bVar1) {
      local_78.name.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.type = (quint64)&DAT_aaaaaaaaaaaaaaaa;
      local_78.name.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      lexem((QString *)&local_78,this);
      QString::remove((longlong)&local_78,0);
      QList<QString>::emplaceBack<QString_const&>(&basicSel->ids,(QString *)&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
    }
    else {
      bVar1 = testClass(this);
      if (bVar1) {
        local_78.function.d.size._4_4_ = 0xaaaaaaaa;
        local_78.type = 0;
        local_78.name.d.d = (Data *)0x0;
        local_78.name.d.ptr = (char16_t *)0x0;
        local_78.name.d.size = 0;
        local_78.function.d.d = (Data *)0x0;
        local_78.function.d.ptr._0_1_ = 0;
        local_78.function.d.ptr._1_7_ = 0;
        local_78.function.d.size._0_4_ = 0;
        QString::operator=((QString *)&local_78,(QLatin1String *)0x5);
        local_78.function.d.size._0_4_ = 2;
        bVar1 = parseClass(this,(QString *)&local_78.name.d.size);
      }
      else {
        bVar1 = testAttrib(this);
        if (!bVar1) {
          bVar1 = testPseudo(this);
          if (bVar1) {
            local_78._57_7_ = 0xaaaaaaaaaaaaaa;
            local_78.type = 0;
            local_78.name.d.d = (Data *)0x0;
            local_78.name.d.ptr = (char16_t *)0x0;
            local_78.name.d.size = 0;
            local_78.function.d.d = (Data *)0x0;
            local_78.function.d.ptr._0_1_ = 0;
            local_78.function.d.ptr._1_7_ = 0;
            local_78.function.d.size._0_4_ = 0;
            local_78.function.d.size._4_4_ = 0;
            local_78.negated = false;
            bVar1 = parsePseudo(this,&local_78);
            if (bVar1) {
              QList<QCss::Pseudo>::emplaceBack<QCss::Pseudo_const&>(&basicSel->pseudos,&local_78);
              Pseudo::~Pseudo(&local_78);
              goto LAB_00546f23;
            }
            Pseudo::~Pseudo(&local_78);
            goto LAB_00546f4b;
          }
          bVar4 = uVar2 <= uVar3;
          goto LAB_00546f4d;
        }
        local_78.function.d.size._4_4_ = 0xaaaaaaaa;
        local_78.type = 0;
        local_78.name.d.d = (Data *)0x0;
        local_78.name.d.ptr = (char16_t *)0x0;
        local_78.name.d.size = 0;
        local_78.function.d.d = (Data *)0x0;
        local_78.function.d.ptr._0_1_ = 0;
        local_78.function.d.ptr._1_7_ = 0;
        local_78.function.d.size._0_4_ = 0;
        bVar1 = parseAttrib(this,(AttributeSelector *)&local_78);
      }
      if (bVar1 == false) break;
      QList<QCss::AttributeSelector>::emplaceBack<QCss::AttributeSelector_const&>
                (&basicSel->attributeSelectors,(AttributeSelector *)&local_78);
      AttributeSelector::~AttributeSelector((AttributeSelector *)&local_78);
    }
LAB_00546f23:
    uVar3 = uVar3 + 1;
  } while( true );
  AttributeSelector::~AttributeSelector((AttributeSelector *)&local_78);
LAB_00546f4b:
  bVar4 = false;
LAB_00546f4d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool Parser::parseSimpleSelector(BasicSelector *basicSel)
{
    int minCount = 0;
    if (lookupElementName()) {
        if (!parseElementName(&basicSel->elementName)) return false;
    } else {
        prev();
        minCount = 1;
    }
    bool onceMore;
    int count = 0;
    do {
        onceMore = false;
        if (test(HASH)) {
            QString theid = lexem();
            // chop off leading #
            theid.remove(0, 1);
            basicSel->ids.append(theid);
            onceMore = true;
        } else if (testClass()) {
            onceMore = true;
            AttributeSelector a;
            a.name = "class"_L1;
            a.valueMatchCriterium = AttributeSelector::MatchIncludes;
            if (!parseClass(&a.value)) return false;
            basicSel->attributeSelectors.append(a);
        } else if (testAttrib()) {
            onceMore = true;
            AttributeSelector a;
            if (!parseAttrib(&a)) return false;
            basicSel->attributeSelectors.append(a);
        } else if (testPseudo()) {
            onceMore = true;
            Pseudo ps;
            if (!parsePseudo(&ps)) return false;
            basicSel->pseudos.append(ps);
        }
        if (onceMore) ++count;
    } while (onceMore);
    return count >= minCount;
}